

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsystemtrayicon.cpp
# Opt level: O2

void __thiscall QSystemTrayIconPrivate::remove_sys_qpa(QSystemTrayIconPrivate *this)

{
  QObject::disconnect((QObject *)this->qpa_sys,
                      "2activated(QPlatformSystemTrayIcon::ActivationReason)",
                      *(QObject **)&this->field_0x8,
                      "1_q_emitActivated(QPlatformSystemTrayIcon::ActivationReason)");
  QObject::disconnect<void(QPlatformSystemTrayIcon::*)(),void(QSystemTrayIcon::*)()>
            (this->qpa_sys,
             (offset_in_QPlatformSystemTrayIcon_to_subr)QPlatformSystemTrayIcon::messageClicked,
             (Object *)0x0,*(offset_in_QSystemTrayIcon_to_subr *)&this->field_0x8);
  (**(code **)(*(long *)this->qpa_sys + 0x68))();
  return;
}

Assistant:

void QSystemTrayIconPrivate::remove_sys_qpa()
{
    QObject::disconnect(qpa_sys, SIGNAL(activated(QPlatformSystemTrayIcon::ActivationReason)),
                        q_func(), SLOT(_q_emitActivated(QPlatformSystemTrayIcon::ActivationReason)));
    QObject::disconnect(qpa_sys, &QPlatformSystemTrayIcon::messageClicked,
                        q_func(), &QSystemTrayIcon::messageClicked);
    qpa_sys->cleanup();
}